

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O0

int borg_spell_fail_rate(borg_spells spell)

{
  _Bool _Var1;
  int iVar2;
  borg_magic *as;
  int local_18;
  int spell_num;
  int minfail;
  int chance;
  borg_spells spell_local;
  
  iVar2 = borg_get_spell_number(spell);
  if (iVar2 < 0) {
    chance = 100;
  }
  else {
    spell_num = ((uint)borg_magics[iVar2].sfail +
                (borg.trait[0x23] - (uint)borg_magics[iVar2].level) * -3) - borg.trait[0x21];
    if (borg.trait[0x71] != 0) {
      spell_num = spell_num + 0x14;
    }
    local_18 = borg.trait[0x22];
    _Var1 = flag_has_dbg((player->state).pflags,3,4,"player->state.pflags","(PF_ZERO_FAIL)");
    if ((!_Var1) && (local_18 < 5)) {
      local_18 = 5;
    }
    if ((borg.trait[0x19] == 4) && ((borg_grids[borg.c.y][borg.c.x].info & 0x10) != 0)) {
      spell_num = spell_num + 0x19;
    }
    if (spell_num < local_18) {
      spell_num = local_18;
    }
    if (0x32 < spell_num) {
      spell_num = 0x32;
    }
    if (borg.trait[0x76] != 0) {
      spell_num = spell_num + 0x19;
    }
    if (borg.trait[0x75] != 0) {
      spell_num = spell_num + 0xf;
    }
    if (borg.trait[0x79] != 0) {
      spell_num = spell_num << 1;
    }
    if (0x5f < spell_num) {
      spell_num = 0x5f;
    }
    chance = spell_num;
  }
  return chance;
}

Assistant:

int borg_spell_fail_rate(const enum borg_spells spell)
{
    int chance, minfail;

    int spell_num = borg_get_spell_number(spell);
    if (spell_num < 0)
        return 100;

    borg_magic *as = &borg_magics[spell_num];

    /* Access the spell  */
    chance = as->sfail;

    /* Reduce failure rate by "effective" level adjustment */
    chance -= 3 * (borg.trait[BI_CLEVEL] - as->level);

    /* Reduce failure rate by stat adjustment */
    chance -= borg.trait[BI_FAIL1];

    /* Fear makes the failrate higher */
    if (borg.trait[BI_ISAFRAID])
        chance += 20;

    /* Extract the minimum failure rate */
    minfail = borg.trait[BI_FAIL2];

    /* Non mage characters never get too good */
    if (!player_has(player, PF_ZERO_FAIL)) {
        if (minfail < 5)
            minfail = 5;
    }

    /* Necromancers are punished by being on lit squares */
    /* necromancers like the dark */
    if (borg.trait[BI_CLASS] == CLASS_NECROMANCER &&
        borg_grids[borg.c.y][borg.c.x].info & BORG_LIGHT) {
        chance += 25;

    }

    /* Minimum failure rate and max */
    if (chance < minfail)
        chance = minfail;
    if (chance > 50)
        chance = 50;

    /* Stunning makes spells harder */
    if (borg.trait[BI_ISHEAVYSTUN])
        chance += 25;
    if (borg.trait[BI_ISSTUN])
        chance += 15;

    /* Amnesia makes it harder */
    if (borg.trait[BI_ISFORGET])
        chance *= 2;

    /* Always a 5 percent chance of working */
    if (chance > 95)
        chance = 95;

    /* Return the chance */
    return (chance);
}